

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DGXMLScanner::updateNSMap
          (DGXMLScanner *this,XMLCh *attrPrefix,XMLCh *attrLocalName,XMLCh *attrValue)

{
  XMLStringPool *pXVar1;
  bool bVar2;
  uint uriId;
  Codes CVar3;
  
  if ((attrPrefix != (XMLCh *)0x0) && (*attrPrefix != L'\0')) {
    bVar2 = XMLString::equals(attrLocalName,(XMLCh *)XMLUni::fgXMLNSString);
    CVar3 = NoUseOfxmlnsAsPrefix;
    if (bVar2) {
LAB_002a0771:
      XMLScanner::emitError(&this->super_XMLScanner,CVar3);
    }
    else {
      bVar2 = XMLString::equals(attrLocalName,L"xml");
      if (bVar2) {
        bVar2 = XMLString::equals(attrValue,(XMLCh *)XMLUni::fgXMLURIName);
        CVar3 = PrefixXMLNotMatchXMLURI;
        if (!bVar2) goto LAB_002a0771;
      }
    }
    if ((attrValue == (XMLCh *)0x0) ||
       ((*attrValue == L'\0' && ((this->super_XMLScanner).fXMLVersion == XMLV1_0)))) {
      XMLScanner::emitError
                (&this->super_XMLScanner,NoEmptyStrNamespace,attrLocalName,(XMLCh *)0x0,(XMLCh *)0x0
                 ,(XMLCh *)0x0);
    }
  }
  bVar2 = XMLString::equals(attrValue,(XMLCh *)XMLUni::fgXMLNSURIName);
  CVar3 = NoUseOfxmlnsURI;
  if (!bVar2) {
    bVar2 = XMLString::equals(attrValue,(XMLCh *)XMLUni::fgXMLURIName);
    if (!bVar2) goto LAB_002a0821;
    bVar2 = XMLString::equals(attrLocalName,L"xml");
    CVar3 = XMLURINotMatchXMLPrefix;
    if (bVar2) goto LAB_002a0821;
  }
  XMLScanner::emitError(&this->super_XMLScanner,CVar3);
LAB_002a0821:
  pXVar1 = (this->super_XMLScanner).fURIStringPool;
  uriId = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,attrValue);
  ElemStack::addPrefix(&(this->super_XMLScanner).fElemStack,attrLocalName,uriId);
  return;
}

Assistant:

void DGXMLScanner::updateNSMap(const    XMLCh* const attrPrefix
                               , const  XMLCh* const attrLocalName
                               , const  XMLCh* const attrValue)
{
    //  We either have the default prefix (""), or we point it into the attr
    //  name parameter. Note that the xmlns is not the prefix we care about
    //  here. To us, the 'prefix' is really the local part of the attrName
    //  parameter.
    //
    //  Check 1. xxx is not xmlns
    //        2. if xxx is xml, then yyy must match XMLUni::fgXMLURIName, and vice versa
    //        3. yyy is not XMLUni::fgXMLNSURIName
    //        4. if xxx is not null, then yyy cannot be an empty string.
    if (attrPrefix && *attrPrefix) {

        if (XMLString::equals(attrLocalName, XMLUni::fgXMLNSString))
            emitError(XMLErrs::NoUseOfxmlnsAsPrefix);
        else if (XMLString::equals(attrLocalName, XMLUni::fgXMLString)) {
            if (!XMLString::equals(attrValue, XMLUni::fgXMLURIName))
                emitError(XMLErrs::PrefixXMLNotMatchXMLURI);
        }

        if (!attrValue)
            emitError(XMLErrs::NoEmptyStrNamespace, attrLocalName);
        else if(!*attrValue && fXMLVersion == XMLReader::XMLV1_0)
            emitError(XMLErrs::NoEmptyStrNamespace, attrLocalName);
    }

    if (XMLString::equals(attrValue, XMLUni::fgXMLNSURIName))
        emitError(XMLErrs::NoUseOfxmlnsURI);
    else if (XMLString::equals(attrValue, XMLUni::fgXMLURIName)) {
        if (!XMLString::equals(attrLocalName, XMLUni::fgXMLString))
            emitError(XMLErrs::XMLURINotMatchXMLPrefix);
    }

    //  Ok, we have to get the unique id for the attribute value, which is the
    //  URI that this value should be mapped to. The validator has the
    //  namespace string pool, so we ask him to find or add this new one. Then
    //  we ask the element stack to add this prefix to URI Id mapping.
    fElemStack.addPrefix
    (
        attrLocalName
        , fURIStringPool->addOrFind(attrValue)
    );
}